

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O0

QIconEngine * __thiscall QIconLoader::iconEngine(QIconLoader *this,QString *iconName)

{
  bool bVar1;
  uint uVar2;
  QHash<QAbstractFileIconProvider::IconType,_QIcon> *pQVar3;
  QIconEnginePlugin **ppQVar4;
  pointer pQVar5;
  QDebug *o;
  unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *this_00;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QPlatformTheme *platformTheme;
  int factoryIndex;
  unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> themeEngine;
  unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> iconEngine;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_7;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_6;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_5;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_4;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_3;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_2;
  QFont maybeIconFont;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_fffffffffffffd08;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_stack_fffffffffffffd10;
  QListSpecialMethods<QString> *in_stack_fffffffffffffd18;
  QFontIconEngine *in_stack_fffffffffffffd20;
  QIconLoader *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd34;
  QString *in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  QDebug *in_stack_fffffffffffffd48;
  WritingSystem writingSystem;
  QPlatformTheme *in_stack_fffffffffffffd58;
  QDebug local_268;
  QDebug local_260;
  QDebug local_258 [5];
  QDebug local_230;
  undefined1 *local_228;
  QDebug local_200 [5];
  QDebug local_1d8 [5];
  QDebug local_1b0 [5];
  QDebug local_188 [10];
  QIconEnginePlugin *local_138;
  QDebug local_e0;
  undefined1 *local_d8;
  QDebug local_b0;
  undefined1 *local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  lcIconLoader();
  anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a2043);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(char *)in_stack_fffffffffffffd08,
               (char *)0x2a205c);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58);
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd20,(QString *)in_stack_fffffffffffffd18);
    QDebug::~QDebug(&local_b0);
    local_10 = 0;
  }
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_ptr<QIconEngine,std::default_delete<QIconEngine>>::
  unique_ptr<std::default_delete<QIconEngine>,void>
            ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)in_stack_fffffffffffffd10
            );
  bVar1 = std::optional::operator_cast_to_bool((optional<QIconEnginePlugin_*> *)0x2a20d6);
  writingSystem = (WritingSystem)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  if (!bVar1) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    lcIconLoader();
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    while( true ) {
      writingSystem = (WritingSystem)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_28);
      if (!bVar1) break;
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a2134);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                 (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(char *)in_stack_fffffffffffffd08,
                 (char *)0x2a214d);
      QMessageLogger::debug();
      in_stack_fffffffffffffd48 =
           QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58)
      ;
      themeName(in_stack_fffffffffffffd28);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffd20,(QString *)in_stack_fffffffffffffd18);
      QString::~QString((QString *)0x2a21ac);
      QDebug::~QDebug(&local_e0);
      local_20 = (undefined1 *)((ulong)local_20 & 0xffffffffffffff00);
    }
    in_stack_fffffffffffffd38 = (QString *)qt_iconEngineFactoryLoader();
    themeName(in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd44 = QFactoryLoader::indexOf((QString *)in_stack_fffffffffffffd38);
    QString::~QString((QString *)0x2a2205);
    if (-1 < in_stack_fffffffffffffd44) {
      pQVar3 = qt_iconEngineFactoryLoader();
      QFactoryLoader::instance((int)pQVar3);
      local_138 = qobject_cast<QIconEnginePlugin*>((QObject *)0x2a222d);
      std::optional<QIconEnginePlugin_*>::optional<QIconEnginePlugin_*,_true>
                ((optional<QIconEnginePlugin_*> *)in_stack_fffffffffffffd10,
                 (QIconEnginePlugin **)in_stack_fffffffffffffd08);
      *(undefined8 *)(in_RDI + 8) = local_38;
      *(undefined8 *)(in_RDI + 0x10) = local_30;
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional<QIconEnginePlugin_*> *)0x2a2277);
  if ((bVar1) &&
     (ppQVar4 = std::optional<QIconEnginePlugin_*>::operator*
                          ((optional<QIconEnginePlugin_*> *)0x2a228b),
     *ppQVar4 != (QIconEnginePlugin *)0x0)) {
    ppQVar4 = std::optional<QIconEnginePlugin_*>::value
                        ((optional<QIconEnginePlugin_*> *)in_stack_fffffffffffffd10);
    (**(code **)(*(long *)*ppQVar4 + 0x60))(*ppQVar4,in_RSI);
    std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::reset
              ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
               in_stack_fffffffffffffd10,(pointer)in_stack_fffffffffffffd08);
  }
  bVar1 = hasUserTheme((QIconLoader *)0x2a22c7);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a22dd);
    if (bVar1) {
      pQVar5 = std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::operator->
                         ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a22f0);
      uVar2 = (*pQVar5->_vptr_QIconEngine[0xd])();
      if ((uVar2 & 1) != 0) goto LAB_002a2302;
    }
    else {
LAB_002a2302:
      QFontDatabase::families(writingSystem);
      themeName(in_stack_fffffffffffffd28);
      bVar1 = QListSpecialMethods<QString>::contains
                        (in_stack_fffffffffffffd18,(QString *)in_stack_fffffffffffffd10,
                         (CaseSensitivity)((ulong)in_stack_fffffffffffffd08 >> 0x20));
      in_stack_fffffffffffffd34 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd34);
      QString::~QString((QString *)0x2a234e);
      QList<QString>::~QList((QList<QString> *)0x2a235b);
      if ((in_stack_fffffffffffffd34 & 0x1000000) != 0) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        themeName(in_stack_fffffffffffffd28);
        QFont::QFont((QFont *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,in_stack_fffffffffffffd30,
                     SUB81((ulong)in_stack_fffffffffffffd28 >> 0x38,0));
        QString::~QString((QString *)0x2a23c4);
        QFont::setStyleStrategy
                  ((QFont *)in_stack_fffffffffffffd20,
                   (StyleStrategy)((ulong)in_stack_fffffffffffffd18 >> 0x20));
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        local_50 = &DAT_aaaaaaaaaaaaaaaa;
        lcIconLoader();
        anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_58), bVar1) {
          anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a2429);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                     (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                     (char *)in_stack_fffffffffffffd08,(char *)0x2a2442);
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58);
          QDebug::~QDebug(local_188);
          local_50 = (undefined1 *)((ulong)local_50 & 0xffffffffffffff00);
        }
        in_stack_fffffffffffffd28 = (QIconLoader *)operator_new(0x58);
        QFontIconEngine::QFontIconEngine
                  (in_stack_fffffffffffffd20,(QString *)in_stack_fffffffffffffd18,
                   (QFont *)in_stack_fffffffffffffd10);
        std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::reset
                  ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
                   in_stack_fffffffffffffd10,(pointer)in_stack_fffffffffffffd08);
        QFont::~QFont((QFont *)0x2a24c5);
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a24d4);
    if (bVar1) {
      pQVar5 = std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::operator->
                         ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a24e7);
      uVar2 = (*pQVar5->_vptr_QIconEngine[0xd])();
      if ((uVar2 & 1) == 0) goto LAB_002a25d5;
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    lcIconLoader();
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_68), bVar1) {
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a254c);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                 (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(char *)in_stack_fffffffffffffd08,
                 (char *)0x2a2565);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58);
      QDebug::~QDebug(local_1b0);
      local_60 = (undefined1 *)((ulong)local_60 & 0xffffffffffffff00);
    }
    in_stack_fffffffffffffd20 = (QFontIconEngine *)operator_new(0x50);
    QIconLoaderEngine::QIconLoaderEngine
              ((QIconLoaderEngine *)in_stack_fffffffffffffd20,(QString *)in_stack_fffffffffffffd18);
    std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::reset
              ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
               in_stack_fffffffffffffd10,(pointer)in_stack_fffffffffffffd08);
  }
LAB_002a25d5:
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a25e2);
  if (bVar1) {
    pQVar5 = std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::operator->
                       ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a25f5);
    uVar2 = (*pQVar5->_vptr_QIconEngine[0xd])();
    if ((uVar2 & 1) == 0) goto LAB_002a28aa;
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  lcIconLoader();
  anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_78), bVar1) {
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a265a);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(char *)in_stack_fffffffffffffd08,
               (char *)0x2a2673);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58);
    QDebug::~QDebug(local_1d8);
    local_70 = (undefined1 *)((ulong)local_70 & 0xffffffffffffff00);
  }
  in_stack_fffffffffffffd58 = QGuiApplicationPrivate::platformTheme();
  if (in_stack_fffffffffffffd58 != (QPlatformTheme *)0x0) {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    lcIconLoader();
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_88), bVar1) {
      anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a271c);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                 (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(char *)in_stack_fffffffffffffd08,
                 (char *)0x2a2735);
      QMessageLogger::debug();
      QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58);
      QDebug::~QDebug(local_200);
      local_80 = (undefined1 *)((ulong)local_80 & 0xffffffffffffff00);
    }
    local_228 = &DAT_aaaaaaaaaaaaaaaa;
    (*in_stack_fffffffffffffd58->_vptr_QPlatformTheme[0xf])(in_stack_fffffffffffffd58,in_RSI);
    std::unique_ptr<QIconEngine,std::default_delete<QIconEngine>>::
    unique_ptr<std::default_delete<QIconEngine>,void>
              ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
               in_stack_fffffffffffffd10,(pointer)in_stack_fffffffffffffd08);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a27b1);
    if (bVar1) {
      pQVar5 = std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::operator->
                         ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a27c7);
      uVar2 = (*pQVar5->_vptr_QIconEngine[0xd])();
      if ((uVar2 & 1) == 0) {
        std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::operator=
                  ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
                   in_stack_fffffffffffffd10,
                   (unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
                   in_stack_fffffffffffffd08);
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        lcIconLoader();
        anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_98), bVar1) {
          anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a2840);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
                     (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                     (char *)in_stack_fffffffffffffd08,(char *)0x2a2859);
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58);
          QDebug::~QDebug(&local_230);
          local_90 = (undefined1 *)((ulong)local_90 & 0xffffffffffffff00);
        }
      }
    }
    std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::~unique_ptr
              ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
               in_stack_fffffffffffffd10);
  }
LAB_002a28aa:
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a28b7);
  if (!bVar1) {
    in_stack_fffffffffffffd18 = (QListSpecialMethods<QString> *)operator_new(0x50);
    QIconLoaderEngine::QIconLoaderEngine
              ((QIconLoaderEngine *)in_stack_fffffffffffffd20,(QString *)in_stack_fffffffffffffd18);
    std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::reset
              ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
               in_stack_fffffffffffffd10,(pointer)in_stack_fffffffffffffd08);
  }
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0 = 0xaa;
  uStack_9f = 0xaaaaaaaaaaaaaa;
  lcIconLoader();
  anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_a8), bVar1) {
    anon_unknown.dwarf_12cae7::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x2a293f);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18,
               (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),(char *)in_stack_fffffffffffffd08,
               (char *)0x2a2955);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd58);
    QDebug::QDebug(&local_260,o);
    std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::get
              ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a2998);
    ::operator<<((QDebug *)in_stack_fffffffffffffd38,
                 (QIconEngine *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    QDebug::~QDebug(local_258);
    QDebug::~QDebug(&local_260);
    QDebug::~QDebug(&local_268);
    local_a0 = 0;
  }
  this_00 = (unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)
            std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::release
                      ((unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_> *)0x2a29f5);
  std::unique_ptr<QIconEngine,_std::default_delete<QIconEngine>_>::~unique_ptr(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QIconEngine *)this_00;
}

Assistant:

QIconEngine *QIconLoader::iconEngine(const QString &iconName) const
{
    qCDebug(lcIconLoader) << "Resolving icon engine for icon" << iconName;

    std::unique_ptr<QIconEngine> iconEngine;

    if (!m_factory) {
        qCDebug(lcIconLoader) << "Finding a plugin for theme" << themeName();
        // try to find a plugin that supports the current theme
        const int factoryIndex = qt_iconEngineFactoryLoader()->indexOf(themeName());
        if (factoryIndex >= 0)
            m_factory = qobject_cast<QIconEnginePlugin *>(qt_iconEngineFactoryLoader()->instance(factoryIndex));
    }
    if (m_factory && *m_factory)
        iconEngine.reset(m_factory.value()->create(iconName));

    if (hasUserTheme()) {
        if (!iconEngine || iconEngine->isNull()) {
            if (QFontDatabase::families().contains(themeName())) {
                QFont maybeIconFont(themeName());
                maybeIconFont.setStyleStrategy(QFont::NoFontMerging);
                qCDebug(lcIconLoader) << "Trying font icon engine.";
                iconEngine.reset(new QFontIconEngine(iconName, maybeIconFont));
            }
        }
        if (!iconEngine || iconEngine->isNull()) {
            qCDebug(lcIconLoader) << "Trying loader engine for theme.";
            iconEngine.reset(new QIconLoaderEngine(iconName));
        }
    }

    if (!iconEngine || iconEngine->isNull()) {
        qCDebug(lcIconLoader) << "Icon is not available from theme or fallback theme.";
        if (auto *platformTheme = QGuiApplicationPrivate::platformTheme()) {
            qCDebug(lcIconLoader) << "Trying platform engine.";
            std::unique_ptr<QIconEngine> themeEngine(platformTheme->createIconEngine(iconName));
            if (themeEngine && !themeEngine->isNull()) {
                iconEngine = std::move(themeEngine);
                qCDebug(lcIconLoader) << "Icon provided by platform engine.";
            }
        }
    }
    // We need to maintain the invariant that the QIcon has a valid engine
    if (!iconEngine)
        iconEngine.reset(new QIconLoaderEngine(iconName));

    qCDebug(lcIconLoader) << "Resulting engine" << iconEngine.get();
    return iconEngine.release();
}